

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synchmanager.cpp
# Opt level: O1

PAL_ERROR CorUnix::CPalSynchronizationManager::WakeUpLocalThread
                    (CPalThread *pthrCurrent,CPalThread *pthrTarget,
                    ThreadWakeupReason twrWakeupReason,DWORD dwObjectIndex)

{
  LONG LVar1;
  PAL_ERROR PVar2;
  
  if (!PAL_InitializeChakraCoreCalled) {
    abort();
  }
  (pthrTarget->synchronizationInfo).m_tnwdNativeData.twrWakeupReason = twrWakeupReason;
  (pthrTarget->synchronizationInfo).m_tnwdNativeData.dwObjectIndex = dwObjectIndex;
  LVar1 = GetLocalSynchLockCount(pthrCurrent);
  if (0 < LVar1) {
    PVar2 = DeferThreadConditionSignaling(pthrCurrent,pthrTarget);
    return PVar2;
  }
  PVar2 = SignalThreadCondition(&(pthrTarget->synchronizationInfo).m_tnwdNativeData);
  return PVar2;
}

Assistant:

PAL_ERROR CPalSynchronizationManager::WakeUpLocalThread(
        CPalThread * pthrCurrent,
        CPalThread * pthrTarget,
        ThreadWakeupReason twrWakeupReason,
        DWORD dwObjectIndex)
    {
        PAL_ERROR palErr = NO_ERROR;
        ThreadNativeWaitData * ptnwdNativeWaitData =
            pthrTarget->synchronizationInfo.GetNativeData();

        TRACE("Waking up a local thread [WakeUpReason=%u ObjectIndex=%u "
              "ptnwdNativeWaitData=%p]\n", twrWakeupReason, dwObjectIndex,
              ptnwdNativeWaitData);

        // Set wakeup reason and signaled object index
        ptnwdNativeWaitData->twrWakeupReason = twrWakeupReason;
        ptnwdNativeWaitData->dwObjectIndex   = dwObjectIndex;

#if SYNCHMGR_SUSPENSION_SAFE_CONDITION_SIGNALING
        if (0 < GetLocalSynchLockCount(pthrCurrent))
        {
            // Defer the actual thread signaling to right after
            // releasing the synch lock(s), so that signaling
            // can happen from a thread-suspension safe area
            palErr = DeferThreadConditionSignaling(pthrCurrent, pthrTarget);
        }
        else
        {
            // Signal the target thread's condition
            palErr = SignalThreadCondition(ptnwdNativeWaitData);
        }
#else // SYNCHMGR_SUSPENSION_SAFE_CONDITION_SIGNALING
        // Signal the target thread's condition
        palErr = SignalThreadCondition(ptnwdNativeWaitData);
#endif // SYNCHMGR_SUSPENSION_SAFE_CONDITION_SIGNALING

        return palErr;
    }